

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

Vec_Int_t * Dtt_ManCollect(Dtt_Man_t *p,uint Truth,Vec_Int_t *vFuns)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  uint *puVar3;
  byte bVar4;
  int iVar5;
  uint Truth_00;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  uVar6 = CONCAT44(Truth,Truth);
  vFuns->nSize = 0;
  uVar7 = uVar6;
  if (0 < p->nPerms) {
    lVar8 = 0;
    do {
      if (0 < p->nComps) {
        lVar9 = 0;
        do {
          Truth_00 = -(uint)((p->CmpMask & (uint)uVar7) != 0) ^ (uint)uVar7;
          iVar5 = Dtt_ManCheckHash(p,Truth_00);
          if (iVar5 != 0) {
            Vec_IntPush(vFuns,Truth_00);
          }
          bVar4 = (byte)(1L << ((byte)p->pComps[lVar9] & 0x3f));
          uVar7 = (s_Truths6[p->pComps[lVar9]] & uVar7) >> (bVar4 & 0x3f) |
                  uVar7 << (bVar4 & 0x3f) & s_Truths6[p->pComps[lVar9]];
          lVar9 = lVar9 + 1;
        } while (lVar9 < p->nComps);
      }
      iVar5 = p->pPerms[lVar8];
      bVar4 = (byte)(1L << ((byte)iVar5 & 0x3f));
      uVar7 = (uVar7 & s_PMasks[iVar5][2]) >> (bVar4 & 0x3f) |
              (s_PMasks[iVar5][1] & uVar7) << (bVar4 & 0x3f) | s_PMasks[iVar5][0] & uVar7;
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nPerms);
  }
  if (uVar7 != uVar6) {
    __assert_fail("tCur == (((word)Truth << 32) | (word)Truth)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                  ,0x1fc,"Vec_Int_t *Dtt_ManCollect(Dtt_Man_t *, unsigned int, Vec_Int_t *)");
  }
  pVVar1 = p->vUsedBins;
  if (0 < pVVar1->nSize) {
    piVar2 = pVVar1->pArray;
    puVar3 = p->pBins;
    lVar8 = 0;
    do {
      puVar3[piVar2[lVar8]] = 0xffffffff;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar1->nSize);
  }
  pVVar1->nSize = 0;
  return vFuns;
}

Assistant:

Vec_Int_t * Dtt_ManCollect( Dtt_Man_t * p, unsigned Truth, Vec_Int_t * vFuns )
{
    int i, k, Entry;
    word tCur = ((word)Truth << 32) | (word)Truth;
    Vec_IntClear( vFuns );
    for ( i = 0; i < p->nPerms; i++ )
    {
        for ( k = 0; k < p->nComps; k++ )
        {
//            unsigned tTemp = (unsigned)(tCur & 1 ? ~tCur : tCur);
            unsigned tTemp = (unsigned)(tCur & p->CmpMask ? ~tCur : tCur);
            if ( Dtt_ManCheckHash( p, tTemp ) )
                Vec_IntPush( vFuns, tTemp );
            tCur = Abc_Tt6Flip( tCur, p->pComps[k] );
        }
        tCur = Abc_Tt6SwapAdjacent( tCur, p->pPerms[i] );
    }
    assert( tCur == (((word)Truth << 32) | (word)Truth) );
    // clean hash table
    Vec_IntForEachEntry( p->vUsedBins, Entry, i )
        p->pBins[Entry] = ~0;
    Vec_IntClear( p->vUsedBins );
    //printf( "%d ", Vec_IntSize(vFuns) );
    return vFuns;
}